

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O2

void __thiscall Spc_Dsp::soft_reset_common(Spc_Dsp *this)

{
  (this->m).noise = 0x4000;
  (this->m).echo_offset = 0;
  (this->m).echo_hist_pos = (this->m).echo_hist;
  (this->m).every_other_sample = 1;
  (this->m).phase = 0;
  init_counter(this);
  return;
}

Assistant:

void Spc_Dsp::soft_reset_common()
{
	require( m.ram ); // init() must have been called already
	
	m.noise              = 0x4000;
	m.echo_hist_pos      = m.echo_hist;
	m.every_other_sample = 1;
	m.echo_offset        = 0;
	m.phase              = 0;
	
	init_counter();
}